

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O3

void lj_cdata_free(global_State *g,GCcdata *cd)

{
  long lVar1;
  size_t sVar2;
  
  if ((cd->marked & 0x10) == 0) {
    if (-1 < (char)cd->marked) {
      lVar1 = *(long *)(g->ctype_state).ptr64;
      sVar2 = 0x18;
      if (*(uint *)(lVar1 + (ulong)cd->ctypeid * 0x18) < 0x60000000) {
        sVar2 = (ulong)*(uint *)(lVar1 + (ulong)cd->ctypeid * 0x18 + 4) + 0x10;
      }
      (g->gc).total = (g->gc).total - sVar2;
      (*g->allocf)(g->allocd,cd,sVar2,0);
      return;
    }
    lj_cdata_free_cold_2();
  }
  else {
    lj_cdata_free_cold_1();
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_cdata_free(global_State *g, GCcdata *cd)
{
  if (LJ_UNLIKELY(cd->marked & LJ_GC_CDATA_FIN)) {
    GCobj *root;
    makewhite(g, obj2gco(cd));
    markfinalized(obj2gco(cd));
    if ((root = gcref(g->gc.mmudata)) != NULL) {
      setgcrefr(cd->nextgc, root->gch.nextgc);
      setgcref(root->gch.nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    } else {
      setgcref(cd->nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    }
  } else if (LJ_LIKELY(!cdataisv(cd))) {
    CType *ct = ctype_raw(ctype_ctsG(g), cd->ctypeid);
    CTSize sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_PTR;
    lj_assertG(ctype_hassize(ct->info) || ctype_isfunc(ct->info) ||
	       ctype_isextern(ct->info), "free of ctype without a size");
    lj_mem_free(g, cd, sizeof(GCcdata) + sz);
  } else {
    lj_mem_free(g, memcdatav(cd), sizecdatav(cd));
  }
}